

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O3

str_attr_accessor * __thiscall
pybind11::detail::
object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>::attr
          (str_attr_accessor *__return_storage_ptr__,
          object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_>
          *this,char *key)

{
  handle hVar1;
  object *poVar2;
  long *plVar3;
  object local_20;
  
  poVar2 = accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                     ((accessor<pybind11::detail::accessor_policies::str_attr> *)this);
  hVar1.m_ptr = (poVar2->super_handle).m_ptr;
  local_20.super_handle.m_ptr = (handle)(handle)hVar1.m_ptr;
  plVar3 = (long *)__tls_get_addr(&PTR_0019ddc0);
  *plVar3 = *plVar3 + 1;
  if (hVar1.m_ptr != (PyObject *)0x0) {
    (hVar1.m_ptr)->ob_refcnt = (hVar1.m_ptr)->ob_refcnt + 1;
  }
  (__return_storage_ptr__->obj).m_ptr = hVar1.m_ptr;
  __return_storage_ptr__->key = key;
  (__return_storage_ptr__->cache).super_handle.m_ptr = (PyObject *)0x0;
  object::~object(&local_20);
  return __return_storage_ptr__;
}

Assistant:

str_attr_accessor object_api<D>::attr(const char *key) const {
    return {derived(), key};
}